

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parameters.cpp
# Opt level: O3

void __thiscall
ezc3d::ParametersNS::Parameters::setMandatoryParametersForSpecialGroup
          (Parameters *this,string *groupName)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  bool bVar4;
  int iVar5;
  size_t sVar6;
  Group *this_00;
  Group *this_01;
  Parameter *this_02;
  vector<double,_std::allocator<double>_> *pvVar7;
  Parameter p;
  string local_158;
  string local_138;
  Parameter local_118;
  vector<double,_std::allocator<double>_> local_68;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  
  iVar5 = std::__cxx11::string::compare((char *)groupName);
  if (iVar5 == 0) {
    paVar1 = &local_118._name.field_2;
    local_118._name._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"ROTATION","");
    bVar4 = isGroup(this,&local_118._name);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._name._M_dataplus._M_p != paVar1) {
      operator_delete(local_118._name._M_dataplus._M_p,
                      local_118._name.field_2._M_allocated_capacity + 1);
    }
    if (!bVar4) {
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"ROTATION","");
      local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"");
      GroupNS::Group::Group((Group *)&local_118,&local_138,&local_158);
      group(this,(Group *)&local_118);
      std::
      vector<ezc3d::ParametersNS::GroupNS::Parameter,_std::allocator<ezc3d::ParametersNS::GroupNS::Parameter>_>
      ::~vector((vector<ezc3d::ParametersNS::GroupNS::Parameter,_std::allocator<ezc3d::ParametersNS::GroupNS::Parameter>_>
                 *)&local_118._dimension);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._description._M_dataplus._M_p != &local_118._description.field_2) {
        operator_delete(local_118._description._M_dataplus._M_p,
                        local_118._description.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._name._M_dataplus._M_p != paVar1) {
        operator_delete(local_118._name._M_dataplus._M_p,
                        local_118._name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != &local_158.field_2) {
        operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
    }
    local_118._name._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"ROTATION","");
    sVar6 = groupIdx(this,&local_118._name);
    this_00 = group(this,sVar6);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._name._M_dataplus._M_p != paVar1) {
      operator_delete(local_118._name._M_dataplus._M_p,
                      local_118._name.field_2._M_allocated_capacity + 1);
    }
    local_118._name._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"USED","");
    bVar4 = GroupNS::Group::isParameter(this_00,&local_118._name);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._name._M_dataplus._M_p != paVar1) {
      operator_delete(local_118._name._M_dataplus._M_p,
                      local_118._name.field_2._M_allocated_capacity + 1);
    }
    if (!bVar4) {
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"USED","");
      local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"");
      GroupNS::Parameter::Parameter(&local_118,&local_138,&local_158);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != &local_158.field_2) {
        operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      GroupNS::Parameter::set(&local_118,0);
      GroupNS::Group::parameter(this_00,&local_118);
      GroupNS::Parameter::~Parameter(&local_118);
    }
    local_118._name._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"DATA_START","");
    bVar4 = GroupNS::Group::isParameter(this_00,&local_118._name);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._name._M_dataplus._M_p != paVar1) {
      operator_delete(local_118._name._M_dataplus._M_p,
                      local_118._name.field_2._M_allocated_capacity + 1);
    }
    if (!bVar4) {
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"DATA_START","");
      local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"");
      GroupNS::Parameter::Parameter(&local_118,&local_138,&local_158);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != &local_158.field_2) {
        operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)CONCAT44(local_68.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_start._4_4_,1);
      local_138._M_dataplus._M_p = (pointer)0x0;
      local_138._M_string_length = 0;
      local_138.field_2._M_allocated_capacity = 0;
      std::vector<int,std::allocator<int>>::_M_assign_aux<int_const*>
                ((vector<int,std::allocator<int>> *)&local_138,&local_68);
      local_158._M_dataplus._M_p = (pointer)0x0;
      local_158._M_string_length = 0;
      local_158.field_2._M_allocated_capacity = 0;
      GroupNS::Parameter::set
                (&local_118,(vector<int,_std::allocator<int>_> *)&local_138,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_158);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_158._M_dataplus._M_p,
                        local_158.field_2._M_allocated_capacity - (long)local_158._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_138._M_dataplus._M_p,
                        local_138.field_2._M_allocated_capacity - (long)local_138._M_dataplus._M_p);
      }
      GroupNS::Group::parameter(this_00,&local_118);
      GroupNS::Parameter::~Parameter(&local_118);
    }
    local_118._name._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"RATE","");
    bVar4 = GroupNS::Group::isParameter(this_00,&local_118._name);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._name._M_dataplus._M_p != paVar1) {
      operator_delete(local_118._name._M_dataplus._M_p,
                      local_118._name.field_2._M_allocated_capacity + 1);
    }
    if (!bVar4) {
      paVar2 = &local_138.field_2;
      local_138._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"RATE","");
      paVar3 = &local_158.field_2;
      local_158._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"");
      GroupNS::Parameter::Parameter(&local_118,&local_138,&local_158);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != paVar3) {
        operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar2) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      local_138._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"POINT","");
      sVar6 = groupIdx(this,&local_138);
      this_01 = group(this,sVar6);
      local_158._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"RATE","");
      this_02 = GroupNS::Group::parameter(this_01,&local_158);
      pvVar7 = GroupNS::Parameter::valuesAsDouble(this_02);
      local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator=(&local_68,pvVar7);
      local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      GroupNS::Parameter::set(&local_118,pvVar7,&local_48);
      if (local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_48.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_48.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != paVar3) {
        operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar2) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      GroupNS::Group::parameter(this_00,&local_118);
      GroupNS::Parameter::~Parameter(&local_118);
    }
    local_118._name._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"LABELS","");
    bVar4 = GroupNS::Group::isParameter(this_00,&local_118._name);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._name._M_dataplus._M_p != paVar1) {
      operator_delete(local_118._name._M_dataplus._M_p,
                      local_118._name.field_2._M_allocated_capacity + 1);
    }
    if (!bVar4) {
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"LABELS","");
      local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"");
      GroupNS::Parameter::Parameter(&local_118,&local_138,&local_158);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != &local_158.field_2) {
        operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      local_138._M_dataplus._M_p = (pointer)0x0;
      local_138._M_string_length = 0;
      local_138.field_2._M_allocated_capacity = 0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_assign_aux<std::__cxx11::string_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_138,0,0
                );
      local_158._M_dataplus._M_p = (pointer)0x0;
      local_158._M_string_length = 0;
      local_158.field_2._M_allocated_capacity = 0;
      GroupNS::Parameter::set
                (&local_118,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_138,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_158);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_158._M_dataplus._M_p,
                        local_158.field_2._M_allocated_capacity - (long)local_158._M_dataplus._M_p);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_138);
      GroupNS::Group::parameter(this_00,&local_118);
      GroupNS::Parameter::~Parameter(&local_118);
    }
    local_118._name._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"DESCRIPTIONS","");
    bVar4 = GroupNS::Group::isParameter(this_00,&local_118._name);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._name._M_dataplus._M_p != paVar1) {
      operator_delete(local_118._name._M_dataplus._M_p,
                      local_118._name.field_2._M_allocated_capacity + 1);
    }
    if (!bVar4) {
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"DESCRIPTIONS","");
      local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"");
      GroupNS::Parameter::Parameter(&local_118,&local_138,&local_158);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != &local_158.field_2) {
        operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      local_138._M_dataplus._M_p = (pointer)0x0;
      local_138._M_string_length = 0;
      local_138.field_2._M_allocated_capacity = 0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_assign_aux<std::__cxx11::string_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_138,0,0
                );
      local_158._M_dataplus._M_p = (pointer)0x0;
      local_158._M_string_length = 0;
      local_158.field_2._M_allocated_capacity = 0;
      GroupNS::Parameter::set
                (&local_118,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_138,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_158);
      if (local_158._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(local_158._M_dataplus._M_p,
                        local_158.field_2._M_allocated_capacity - (long)local_158._M_dataplus._M_p);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_138);
      GroupNS::Group::parameter(this_00,&local_118);
      GroupNS::Parameter::~Parameter(&local_118);
    }
  }
  return;
}

Assistant:

void ezc3d::ParametersNS::Parameters::setMandatoryParametersForSpecialGroup(
    const std::string &groupName) {
  // Mandatory groups
  if (!groupName.compare("ROTATION")) {
    if (!isGroup("ROTATION")) {
      group(ezc3d::ParametersNS::GroupNS::Group("ROTATION"));
    }

    ezc3d::ParametersNS::GroupNS::Group &grp(group("ROTATION"));
    if (!grp.isParameter("USED")) {
      ezc3d::ParametersNS::GroupNS::Parameter p("USED", "");
      p.set(0);
      grp.parameter(p);
    }
    if (!grp.isParameter("DATA_START")) {
      ezc3d::ParametersNS::GroupNS::Parameter p("DATA_START", "");
      p.set(std::vector<int>() = {1});
      grp.parameter(p);
    }
    if (!grp.isParameter("RATE")) {
      // Double is better as default than RATIO as RATIO is chosen in
      // priority when writing.
      ezc3d::ParametersNS::GroupNS::Parameter p("RATE", "");
      p.set(std::vector<double>() =
                group("POINT").parameter("RATE").valuesAsDouble());
      grp.parameter(p);
    }
    if (!grp.isParameter("LABELS")) {
      ezc3d::ParametersNS::GroupNS::Parameter p("LABELS", "");
      p.set(std::vector<std::string>() = {});
      grp.parameter(p);
    }
    if (!grp.isParameter("DESCRIPTIONS")) {
      ezc3d::ParametersNS::GroupNS::Parameter p("DESCRIPTIONS", "");
      p.set(std::vector<std::string>() = {});
      grp.parameter(p);
    }
  }
}